

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

X509 * d2i_X509(X509 **a,uchar **in,long len)

{
  uint8_t *puVar1;
  undefined1 local_38 [8];
  CBS cbs;
  X509 *ret;
  long len_local;
  uint8_t **inp_local;
  X509 **out_local;
  
  cbs.len = 0;
  if (len < 0) {
    ERR_put_error(0xc,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,0xc2);
  }
  else {
    CBS_init((CBS *)local_38,*in,len);
    cbs.len = (size_t)x509_parse((CBS *)local_38,(CRYPTO_BUFFER *)0x0);
    if ((X509 *)cbs.len != (X509 *)0x0) {
      puVar1 = CBS_data((CBS *)local_38);
      *in = puVar1;
    }
  }
  if (a != (X509 **)0x0) {
    X509_free(*a);
    *a = (X509 *)cbs.len;
  }
  return (X509 *)cbs.len;
}

Assistant:

X509 *d2i_X509(X509 **out, const uint8_t **inp, long len) {
  X509 *ret = NULL;
  if (len < 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_BUFFER_TOO_SMALL);
    goto err;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  ret = x509_parse(&cbs, NULL);
  if (ret == NULL) {
    goto err;
  }

  *inp = CBS_data(&cbs);

err:
  if (out != NULL) {
    X509_free(*out);
    *out = ret;
  }
  return ret;
}